

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void libtorrent::dht::anon_unknown_0::announce_fun
               (vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *v,node *node,int listen_port,sha1_hash *ih,announce_flags_t flags)

{
  routing_table *prVar1;
  node *pnVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  size_type sVar7;
  rpc_manager *prVar8;
  entry *peVar9;
  long i;
  counters *this;
  element_type *peVar10;
  span<const_char> in;
  shared_ptr<libtorrent::dht::observer> local_210;
  endpoint local_200;
  bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void> local_1e1;
  string_view local_1e0;
  undefined1 local_1cb;
  uchar local_1ca;
  bitfield_flag local_1c9;
  string_view local_1c8;
  undefined1 local_1b3;
  uchar local_1b2;
  bitfield_flag local_1b1;
  string_view local_1b0;
  string_type local_1a0;
  string_view local_180;
  string_view local_170;
  span<const_char> local_160;
  string_view local_150;
  entry *local_140;
  entry *a;
  string_view local_128;
  undefined1 local_118 [8];
  entry e;
  undefined1 local_d0 [8];
  shared_ptr<libtorrent::dht::announce_observer> o;
  pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  undefined1 local_88 [8];
  shared_ptr<libtorrent::dht::traversal_algorithm> algo;
  span<char_const> local_68 [16];
  string local_58;
  routing_table *local_38;
  dht_observer *logger;
  sha1_hash *ih_local;
  node *pnStack_20;
  int listen_port_local;
  node *node_local;
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *v_local;
  announce_flags_t flags_local;
  
  logger = (dht_observer *)ih;
  ih_local._4_4_ = listen_port;
  pnStack_20 = node;
  node_local = (node *)v;
  v_local._7_1_ = flags.m_val;
  local_38 = (routing_table *)dht::node::observer(node);
  if ((local_38 != (routing_table *)0x0) &&
     (uVar4 = (**((dht_logger *)&local_38->m_log)->_vptr_dht_logger)(local_38,1), prVar1 = local_38,
     (uVar4 & 1) != 0)) {
    span<char_const>::span<libtorrent::digest32<160l>,char,void>(local_68,(digest32<160L> *)logger);
    in.m_len = (difference_type)ih;
    in.m_ptr = (char *)local_68._8_8_;
    libtorrent::aux::to_hex_abi_cxx11_(&local_58,(aux *)local_68._0_8_,in);
    uVar6 = ::std::__cxx11::string::c_str();
    uVar4 = ih_local._4_4_;
    sVar7 = ::std::
            vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)node_local);
    (*((dht_logger *)&prVar1->m_log)->_vptr_dht_logger[1])
              (prVar1,1,"sending announce_peer [ ih: %s  p: %d nodes: %d ]",uVar6,(ulong)uVar4,
               sVar7 & 0xffffffff);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  pnVar2 = pnStack_20;
  digest32<160L>::digest32((digest32<160L> *)((long)&__range2 + 4));
  ::std::
  make_shared<libtorrent::dht::traversal_algorithm,libtorrent::dht::node&,libtorrent::digest32<160l>>
            ((node *)local_88,(digest32<160L> *)pnVar2);
  pnVar2 = node_local;
  __end2 = ::std::
           vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)node_local);
  p = (pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)::std::
         vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)pnVar2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&p), bVar3) {
    o.super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<const_std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end2);
    if ((local_38 != (routing_table *)0x0) &&
       (uVar4 = (**((dht_logger *)&local_38->m_log)->_vptr_dht_logger)(local_38,1),
       prVar1 = local_38, (uVar4 & 1) != 0)) {
      iVar5 = distance_exp((node_id *)logger,
                           (node_id *)
                           (o.
                            super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 1));
      (*((dht_logger *)&prVar1->m_log)->_vptr_dht_logger[1])
                (prVar1,1,"announce-distance: %d",(ulong)(0xa0 - iVar5));
    }
    prVar8 = &pnStack_20->m_rpc;
    node_entry::ep((endpoint *)
                   &e.super_variant_type.
                    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                    .
                    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                    .
                    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                    .
                    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                    .
                    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                    .
                    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                    .field_0x24,
                   (node_entry *)
                   o.
                   super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
    rpc_manager::
    allocate_observer<libtorrent::dht::announce_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,libtorrent::digest32<160l>const&>
              ((rpc_manager *)local_d0,(shared_ptr<libtorrent::dht::traversal_algorithm> *)prVar8,
               (basic_endpoint<boost::asio::ip::udp> *)local_88,
               (digest32<160L> *)
               &e.super_variant_type.
                super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                .
                super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                .
                super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                .
                super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                .
                super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                .
                super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                .field_0x24);
    bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
    if (bVar3) {
      entry::entry((entry *)local_118);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"y");
      peVar9 = entry::operator[]((entry *)local_118,local_128);
      entry::operator=(peVar9,"q");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&a,"q");
      peVar9 = entry::operator[]((entry *)local_118,_a);
      entry::operator=(peVar9,"announce_peer");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"a");
      local_140 = entry::operator[]((entry *)local_118,local_150);
      span<char_const>::span<libtorrent::digest32<160l>,char,void>
                ((span<char_const> *)&local_160,(digest32<160L> *)logger);
      peVar9 = local_140;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_170,"info_hash");
      peVar9 = entry::operator[](peVar9,local_170);
      entry::operator=(peVar9,local_160);
      peVar9 = local_140;
      i = (long)(int)ih_local._4_4_;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"port");
      peVar9 = entry::operator[](peVar9,local_180);
      entry::operator=(peVar9,i);
      ::std::__cxx11::string::string
                ((string *)&local_1a0,
                 (string *)
                 (o.
                  super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi + 4));
      peVar9 = local_140;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,"token")
      ;
      peVar9 = entry::operator[](peVar9,local_1b0);
      entry::operator=(peVar9,&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      local_1b2 = v_local._7_1_;
      local_1b3 = 1;
      local_1b1 = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
                              )v_local._7_1_,
                             (bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
                              )0x1);
      bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1b1);
      peVar9 = local_140;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"seed");
      peVar9 = entry::operator[](peVar9,local_1c8);
      entry::operator=(peVar9,(ulong)bVar3);
      local_1ca = v_local._7_1_;
      local_1cb = 2;
      local_1c9 = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
                              )v_local._7_1_,
                             (bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
                              )0x2);
      bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1c9);
      peVar9 = local_140;
      if (bVar3) {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1e0,"implied_port");
        peVar9 = entry::operator[](peVar9,local_1e0);
        entry::operator=(peVar9,1);
      }
      this = dht::node::stats_counters(pnStack_20);
      counters::inc_stats_counter(this,0x96,1);
      local_1e1.m_val = '\x01';
      peVar10 = ::std::
                __shared_ptr_access<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_d0);
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
      operator|=(&(peVar10->super_observer).flags,local_1e1);
      prVar8 = &pnStack_20->m_rpc;
      node_entry::ep(&local_200,
                     (node_entry *)
                     o.
                     super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
      ::std::shared_ptr<libtorrent::dht::observer>::
      shared_ptr<libtorrent::dht::announce_observer,void>
                (&local_210,(shared_ptr<libtorrent::dht::announce_observer> *)local_d0);
      rpc_manager::invoke(prVar8,(entry *)local_118,&local_200,&local_210);
      ::std::shared_ptr<libtorrent::dht::observer>::~shared_ptr(&local_210);
      entry::~entry((entry *)local_118);
      e.super_variant_type.
      super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      ._M_index = '\0';
      e.super_variant_type.
      super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      ._33_3_ = 0;
    }
    else {
      e.super_variant_type.
      super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      ._M_index = '\x01';
      e.super_variant_type.
      super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      .
      super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
      ._33_3_ = 0;
    }
    ::std::shared_ptr<libtorrent::dht::announce_observer>::~shared_ptr
              ((shared_ptr<libtorrent::dht::announce_observer> *)local_d0);
    if (e.super_variant_type.
        super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
        .
        super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
        .
        super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
        .
        super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
        .
        super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
        .
        super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
        ._32_4_ != 0) goto LAB_00815e8c;
    __gnu_cxx::
    __normal_iterator<const_std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end2);
  }
  e.super_variant_type.
  super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  ._M_index = '\0';
  e.super_variant_type.
  super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  ._33_3_ = 0;
LAB_00815e8c:
  ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::~shared_ptr
            ((shared_ptr<libtorrent::dht::traversal_algorithm> *)local_88);
  return;
}

Assistant:

void announce_fun(std::vector<std::pair<node_entry, std::string>> const& v
		, node& node, int const listen_port, sha1_hash const& ih, announce_flags_t const flags)
	{
#ifndef TORRENT_DISABLE_LOGGING
		auto* logger = node.observer();
		if (logger != nullptr && logger->should_log(dht_logger::node))
		{
			logger->log(dht_logger::node, "sending announce_peer [ ih: %s "
				" p: %d nodes: %d ]", aux::to_hex(ih).c_str(), listen_port, int(v.size()));
		}
#endif

		// create a dummy traversal_algorithm
		auto algo = std::make_shared<traversal_algorithm>(node, node_id());
		// store on the first k nodes
		for (auto const& p : v)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::node))
			{
				logger->log(dht_logger::node, "announce-distance: %d"
					, (160 - distance_exp(ih, p.first.id)));
			}
#endif

			auto o = node.m_rpc.allocate_observer<announce_observer>(algo
				, p.first.ep(), p.first.id);
			if (!o) return;
#if TORRENT_USE_ASSERTS
			o->m_in_constructor = false;
#endif
			entry e;
			e["y"] = "q";
			e["q"] = "announce_peer";
			entry& a = e["a"];
			a["info_hash"] = ih;
			a["port"] = listen_port;
			a["token"] = p.second;
			a["seed"] = (flags & announce::seed) ? 1 : 0;
			if (flags & announce::implied_port) a["implied_port"] = 1;
			node.stats_counters().inc_stats_counter(counters::dht_announce_peer_out);
			o->flags |= observer::flag_queried;
			node.m_rpc.invoke(e, p.first.ep(), o);
		}
	}